

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Index __thiscall
wasm::OptimizeInstructions::getSignExtBits(OptimizeInstructions *this,Expression *curr)

{
  Expression *pEVar1;
  LocalGet *pLVar2;
  reference pvVar3;
  LocalGet *get;
  Expression *curr_local;
  OptimizeInstructions *this_local;
  
  pEVar1 = Properties::getSignExtValue(curr);
  if (pEVar1 == (Expression *)0x0) {
    pLVar2 = Expression::dynCast<wasm::LocalGet>(curr);
    if (pLVar2 == (LocalGet *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      pvVar3 = std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::operator[]
                         (&this->localInfo,(ulong)pLVar2->index);
      this_local._4_4_ = pvVar3->signExtBits;
    }
  }
  else {
    this_local._4_4_ = Properties::getSignExtBits(curr);
  }
  return this_local._4_4_;
}

Assistant:

Index getSignExtBits(Expression* curr) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr);
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // Check what we know about the local.
      return localInfo[get->index].signExtBits;
    }
    return 0;
  }